

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane-test.c++:320:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:320:17)>
            *this)

{
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  RStack_98;
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  local_60;
  Maybe<capnp::MessageSize> local_28;
  
  local_28.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Client::makeThingRequest
            (&local_60,&((this->f).env)->membraned,&local_28);
  capnp::
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  ::send(&RStack_98,(int)&local_60,__buf,in_RCX,in_R8D);
  capnproto_test::capnp::test::TestMembrane::MakeThingResults::Pipeline::getThing
            (__return_storage_ptr__,(Pipeline *)&RStack_98.super_Builder._builder.data);
  capnp::RemotePromise<capnproto_test::capnp::test::TestMembrane::MakeThingResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMembrane::MakeThingResults> *)
             &RStack_98);
  Own<capnp::RequestHook>::dispose(&local_60.hook);
  capnp::Capability::Client::whenResolved((Client *)&RStack_98);
  Promise<void>::wait((Promise<void> *)&RStack_98,&((this->f).env)->waitScope);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&RStack_98);
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }